

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads_kernel_2.h
# Opt level: O0

void __thiscall dlib::mutex::mutex(mutex *this)

{
  int iVar1;
  string *a;
  pthread_mutex_t *in_RDI;
  error_type t;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffc4;
  undefined1 local_29 [9];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  iVar1 = pthread_mutex_init(in_RDI,(pthread_mutexattr_t *)0x0);
  if (iVar1 != 0) {
    uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffc0);
    a = (string *)__cxa_allocate_exception(0x30);
    t = (error_type)((ulong)local_29 >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    thread_error::thread_error((thread_error *)CONCAT44(in_stack_ffffffffffffffc4,uVar2),t,a);
    __cxa_throw(a,&thread_error::typeinfo,thread_error::~thread_error);
  }
  return;
}

Assistant:

mutex (
        )
        { 
            if (pthread_mutex_init(&myMutex,0)) 
            {
                throw dlib::thread_error(ECREATE_MUTEX,
        "in function mutex::mutex() an error occurred making the mutex"
                );      
            }
        }